

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O2

string * __thiscall
libtorrent::aux::torrent_peer::to_string_abi_cxx11_
          (string *__return_storage_ptr__,torrent_peer *this)

{
  allocator<char> local_31;
  string_view local_30;
  
  if ((this->field_0x1e & 2) == 0) {
    address(this);
    boost::asio::ip::address::to_string_abi_cxx11_(__return_storage_ptr__,(address *)&local_30);
  }
  else {
    local_30 = dest(this);
    ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_30,&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_peer::to_string() const
	{
		TORRENT_ASSERT(in_use);
#if TORRENT_USE_I2P
		if (is_i2p_addr) return std::string(dest());
#endif
		return address().to_string();
	}